

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-wizard.c
# Opt level: O3

void wiz_create_item(_Bool art)

{
  uint32_t *puVar1;
  ushort uVar2;
  player *p;
  menu_conflict *menu;
  char *pcVar3;
  ulong uVar4;
  undefined7 in_register_00000039;
  long lVar5;
  ulong uVar6;
  wchar_t *pwVar7;
  int iVar8;
  wchar_t tvals [36];
  int local_b8 [38];
  
  menu = menu_new(MN_SKIN_COLUMNS,&wiz_create_item_menu);
  pcVar3 = "What kind of object?";
  if ((int)CONCAT71(in_register_00000039,art) != 0) {
    pcVar3 = "What kind of artifact?";
  }
  choose_artifact = art;
  menu->selections = "abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ";
  menu->title = pcVar3;
  uVar4 = 0;
  iVar8 = 0;
  do {
    if (kb_info[uVar4].name != (char *)0x0) {
      if (art) {
        uVar2 = z_info->a_max;
        uVar6 = 1;
        if (uVar2 < 2) {
LAB_0020e183:
          if ((uint)uVar6 != (uint)uVar2) goto LAB_0020e188;
        }
        else {
          uVar6 = 1;
          pwVar7 = &a_info[1].tval;
          do {
            if (uVar4 == (uint)*pwVar7) goto LAB_0020e183;
            uVar6 = uVar6 + 1;
            pwVar7 = pwVar7 + 0x50;
          } while ((uint)uVar2 != uVar6);
        }
      }
      else {
LAB_0020e188:
        lVar5 = (long)iVar8;
        iVar8 = iVar8 + 1;
        local_b8[lVar5] = (int)uVar4;
      }
    }
    uVar4 = uVar4 + 1;
    if (uVar4 == 0x24) {
      local_b8[iVar8] = -9999;
      screen_save();
      clear_from(L'\0');
      menu_setpriv(menu,0x24,kb_info);
      menu_set_filter(menu,local_b8,iVar8 + 1);
      menu_layout(menu,&wiz_create_item_area);
      menu_select(menu,0,false);
      screen_load();
      mem_free(menu);
      p = player;
      puVar1 = &player->upkeep->redraw;
      *puVar1 = *puVar1 | 0x810000;
      handle_stuff(p);
      return;
    }
  } while( true );
}

Assistant:

void wiz_create_item(bool art)
{
	int tvals[TV_MAX];
	int i, n;

	struct menu *menu = menu_new(MN_SKIN_COLUMNS, &wiz_create_item_menu);

	choose_artifact = art;

	menu->selections = all_letters;
	menu->title = art ? "What kind of artifact?" : "What kind of object?";

	/* Make a list of all tvals for the filter */
	for (i = 0, n = 0; i < TV_MAX; i++) {
		/* Only real object bases */
		if (!kb_info[i].name) continue;

		/*
		 * For artifact creation, only include tvals which have an
		 * artifact.
		 */
		if (art) {
			int j;
			for (j = 1; j < z_info->a_max; j++) {
				const struct artifact *art_local = &a_info[j];
				if (art_local->tval == i) break;
			}
			if (j == z_info->a_max) continue;
		}

		tvals[n++] = i;
	}

	tvals[n++] = WIZ_CREATE_ALL_MENU_ITEM;

	screen_save();
	clear_from(0);

	menu_setpriv(menu, TV_MAX, kb_info);
	menu_set_filter(menu, tvals, n);
	menu_layout(menu, &wiz_create_item_area);
	menu_select(menu, 0, false);

	screen_load();
	mem_free(menu);

	/* Redraw map */
	player->upkeep->redraw |= (PR_MAP | PR_ITEMLIST);
	handle_stuff(player);
}